

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampTest::iterate
          (TextureBorderClampTest *this)

{
  size_type *psVar1;
  TestLog *log;
  code *pcVar2;
  RenderContext *context;
  pointer pfVar3;
  CompareMode CVar4;
  SamplerType SVar5;
  deUint32 dVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 uVar9;
  undefined8 *puVar10;
  TextureFormat format;
  char *pcVar11;
  size_t sVar12;
  undefined4 extraout_var;
  RenderTarget *renderTarget;
  SeedBuilder *pSVar13;
  ObjectWrapper *this_00;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  undefined4 extraout_var_01;
  pointer *ppcVar14;
  undefined8 uVar15;
  pointer pcVar16;
  undefined1 auVar17 [8];
  float fVar18;
  int iVar19;
  long lVar20;
  long *plVar21;
  string borderColorString;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  sampler;
  RandomViewport viewport;
  string iterationDesc;
  ScopedLogSection section;
  Surface renderedFrame;
  ReferenceParams samplerParams;
  IterationConfig iterationConfig;
  ostringstream s;
  vector<float,_std::allocator<float>_> texCoord;
  undefined1 local_3a8 [16];
  undefined1 *local_398;
  long local_390;
  undefined2 local_388;
  undefined1 local_386;
  deUint32 local_380;
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  local_378;
  undefined1 local_368 [16];
  long local_358;
  undefined2 local_350;
  undefined1 local_34e;
  RandomViewport local_348;
  string local_338;
  ScopedLogSection local_318;
  Surface local_310;
  undefined1 local_2f8 [16];
  pointer local_2e8;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  Vector<float,_4> local_2d4;
  Vector<float,_4> local_2c4;
  TextureFormat local_2b4;
  undefined8 uStack_2ac;
  pointer local_2a4;
  bool bStack_29c;
  undefined3 uStack_29b;
  CompareMode CStack_298;
  undefined4 local_28c;
  VertexComponentConversion VStack_280;
  DepthStencilMode DStack_27c;
  LodMode local_278;
  IterationConfig local_260;
  undefined1 local_1e8 [8];
  _Alloc_hider _Stack_1e0;
  undefined1 local_1d8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1d0;
  undefined4 local_1c0;
  undefined4 uStack_1b8;
  VertexComponentConversion VStack_1b4;
  DepthStencilMode DStack_1b0;
  int iStack_1ac;
  int local_1a8;
  undefined1 *local_1a0;
  undefined4 local_198;
  long *local_190 [2];
  long local_180;
  ios_base local_178 [8];
  ios_base local_170 [8];
  undefined8 local_168;
  undefined8 uStack_160;
  undefined4 local_158;
  float *local_150;
  vector<float,_std::allocator<float>_> local_68;
  Enum<int,_2UL> local_50;
  long local_40;
  undefined2 local_38;
  undefined1 local_36;
  
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
            (&local_260,this,(ulong)(uint)this->m_iterationNdx);
  iVar7 = this->m_iterationNdx;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  std::ostream::operator<<(local_1e8,iVar7 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base(local_178);
  puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)local_3a8,0,(char *)0x0,0x1c97cd7);
  ppcVar14 = (pointer *)(puVar10 + 2);
  if ((pointer *)*puVar10 == ppcVar14) {
    local_2e8 = *ppcVar14;
    fStack_2e0 = *(float *)(puVar10 + 3);
    fStack_2dc = *(float *)((long)puVar10 + 0x1c);
    local_2f8._0_8_ = &local_2e8;
  }
  else {
    local_2e8 = *ppcVar14;
    local_2f8._0_8_ = (pointer *)*puVar10;
  }
  local_2f8._8_8_ = puVar10[1];
  *puVar10 = ppcVar14;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  if (local_260.description._M_string_length == 0) {
    local_1e8 = (undefined1  [8])local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,0x1b32ab9);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   " - ",&local_260.description);
  }
  pcVar16 = (pointer)0xf;
  if ((pointer *)local_2f8._0_8_ != &local_2e8) {
    pcVar16 = local_2e8;
  }
  if (pcVar16 < _Stack_1e0._M_p + local_2f8._8_8_) {
    auVar17 = (undefined1  [8])(pointer)0xf;
    if (local_1e8 != (undefined1  [8])local_1d8) {
      auVar17 = local_1d8;
    }
    if ((ulong)auVar17 < _Stack_1e0._M_p + local_2f8._8_8_) goto LAB_015125ff;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)local_1e8,0,(char *)0x0,local_2f8._0_8_);
  }
  else {
LAB_015125ff:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append(local_2f8,(ulong)local_1e8);
  }
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  psVar1 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_338.field_2._M_allocated_capacity = *psVar1;
    local_338.field_2._8_8_ = puVar10[3];
  }
  else {
    local_338.field_2._M_allocated_capacity = *psVar1;
    local_338._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_338._M_string_length = puVar10[1];
  *puVar10 = psVar1;
  puVar10[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,(ulong)((long)local_1d8 + 1));
  }
  if ((pointer *)local_2f8._0_8_ != &local_2e8) {
    operator_delete((void *)local_2f8._0_8_,(ulong)(local_2e8 + 1));
  }
  if ((undefined1 **)local_3a8._0_8_ != &local_398) {
    operator_delete((void *)local_3a8._0_8_,(ulong)(local_398 + 1));
  }
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"Iteration","");
  tcu::ScopedLogSection::ScopedLogSection(&local_318,log,(string *)local_1e8,&local_338);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,(ulong)((long)local_1d8 + 1));
  }
  tcu::Surface::Surface(&local_310,0x80,0x80);
  format = tcu::getEffectiveDepthStencilTextureFormat
                     ((TextureFormat *)
                      &((this->m_texture).
                        super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data
                       .ptr)->m_refTexture,this->m_sampleMode);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_2f8,TEXTURETYPE_2D);
  glu::mapGLSampler((Sampler *)local_1e8,local_260.sWrapMode,local_260.tWrapMode,local_260.minFilter
                    ,local_260.magFilter);
  local_2a4 = (pointer)local_1d8;
  bStack_29c = (bool)aStack_1d0._M_local_buf[0];
  uStack_29b = aStack_1d0._M_allocated_capacity._1_3_;
  CStack_298 = aStack_1d0._M_allocated_capacity._4_4_;
  local_2b4.order = local_1e8._0_4_;
  local_2b4.type = local_1e8._4_4_;
  uStack_2ac = (_func_int **)_Stack_1e0._M_p;
  VStack_280 = VStack_1b4;
  local_28c = local_260.borderColor.v.uData[1];
  CVar4 = COMPAREMODE_NONE;
  if (this->m_useShadowSampler == true) {
    CVar4 = glu::mapGLCompareFunc(local_260.compareMode);
  }
  CStack_298 = CVar4;
  DStack_27c = this->m_sampleMode;
  local_278 = LODMODE_EXACT;
  SVar5 = SAMPLERTYPE_SHADOW;
  if (this->m_useShadowSampler == false) {
    SVar5 = glu::TextureTestUtil::getSamplerType(format);
  }
  local_2f8._4_4_ = SVar5;
  local_2d4.m_data[0] = local_260.lookupScale.m_data[0];
  local_2d4.m_data[1] = local_260.lookupScale.m_data[1];
  local_2d4.m_data[2] = local_260.lookupScale.m_data[2];
  local_2d4.m_data[3] = local_260.lookupScale.m_data[3];
  local_2c4.m_data[0] = local_260.lookupBias.m_data[0];
  local_2c4.m_data[1] = local_260.lookupBias.m_data[1];
  local_2c4.m_data[2] = local_260.lookupBias.m_data[2];
  local_2c4.m_data[3] = local_260.lookupBias.m_data[3];
  local_2d8 = local_260.compareRef;
  isDepthFormat(this->m_texFormat,this->m_sampleMode);
  if (this->m_channelClass == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    local_368._12_4_ = local_260.borderColor.v.uData[3];
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    tcu::operator<<((ostream *)local_1e8,(Vector<unsigned_int,_4> *)local_368);
    std::__cxx11::stringbuf::str();
  }
  else if (this->m_channelClass == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    local_368._12_4_ = local_260.borderColor.v.uData[3];
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    tcu::operator<<((ostream *)local_1e8,(Vector<int,_4> *)local_368);
    std::__cxx11::stringbuf::str();
  }
  else {
    local_368._12_4_ = local_260.borderColor.v.uData[3];
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    tcu::operator<<((ostream *)local_1e8,(Vector<float,_4> *)local_368);
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base(local_178);
  local_1e8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&_Stack_1e0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&_Stack_1e0,"Rendering full screen quad, tex coords bottom-left: ",0x34);
  tcu::operator<<((ostream *)&_Stack_1e0,&local_260.p0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_1e0,", top-right ",0xc);
  tcu::operator<<((ostream *)&_Stack_1e0,&local_260.p1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_1e0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_1e0,"Border color is ",0x10)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&_Stack_1e0,(char *)local_3a8._0_8_,local_3a8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_1e0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&_Stack_1e0,"Texture lookup bias: ",0x15);
  tcu::operator<<((ostream *)&_Stack_1e0,&local_2c4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_1e0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&_Stack_1e0,"Texture lookup scale: ",0x16);
  tcu::operator<<((ostream *)&_Stack_1e0,&local_2d4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_1e0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_1e0,"Filters: min = ",0xf);
  dVar6 = glu::getGLFilterMode(uStack_2ac._4_4_);
  pcVar11 = glu::getTextureFilterName(dVar6);
  iVar7 = (int)(ostringstream *)&_Stack_1e0;
  if (pcVar11 == (char *)0x0) {
    std::ios::clear(iVar7 + (int)*(_func_int **)(_Stack_1e0._M_p + -0x18));
  }
  else {
    sVar12 = strlen(pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_1e0,pcVar11,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_1e0,", mag = ",8);
  dVar6 = glu::getGLFilterMode((FilterMode)local_2a4);
  pcVar11 = glu::getTextureFilterName(dVar6);
  if (pcVar11 == (char *)0x0) {
    std::ios::clear(iVar7 + (int)*(_func_int **)(_Stack_1e0._M_p + -0x18));
  }
  else {
    sVar12 = strlen(pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_1e0,pcVar11,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_1e0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_1e0,"Wrap mode: s = ",0xf);
  local_368._0_8_ = glu::getRepeatModeName;
  local_368._8_4_ = local_260.sWrapMode;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_368,(ostream *)&_Stack_1e0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_1e0,", t = ",6);
  local_50.m_getName = glu::getRepeatModeName;
  local_50.m_value = local_260.tWrapMode;
  tcu::Format::Enum<int,_2UL>::toStream(&local_50,(ostream *)&_Stack_1e0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_1e0,"\n",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&_Stack_1e0);
  std::ios_base::~ios_base(local_170);
  if (this->m_sampleMode == MODE_STENCIL) {
    local_1e8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&_Stack_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&_Stack_1e0,"Depth stencil texture mode is STENCIL_INDEX",0x2b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_01512cd3:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&_Stack_1e0);
    std::ios_base::~ios_base(local_170);
  }
  else if (this->m_sampleMode == MODE_DEPTH) {
    local_1e8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&_Stack_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&_Stack_1e0,"Depth stencil texture mode is DEPTH_COMPONENT",0x2d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    goto LAB_01512cd3;
  }
  if ((float)local_260.compareMode != 0.0) {
    local_1e8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&_Stack_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&_Stack_1e0,"Texture mode is COMPARE_REF_TO_TEXTURE, mode = ",0x2f);
    local_368._0_8_ = glu::getCompareFuncName;
    local_368._8_4_ = local_260.compareMode;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_368,(ostream *)&_Stack_1e0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_1e0,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&_Stack_1e0,"Compare reference value = ",0x1a);
    std::ostream::_M_insert<double>((double)local_260.compareRef);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_1e0,"\n",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&_Stack_1e0);
    std::ios_base::~ios_base(local_170);
  }
  if ((undefined1 **)local_3a8._0_8_ != &local_398) {
    operator_delete((void *)local_3a8._0_8_,(ulong)(local_398 + 1));
  }
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar20 = CONCAT44(extraout_var,iVar7);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  tcu::SeedBuilder::SeedBuilder((SeedBuilder *)local_3a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1e8,
             (this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p,
             (allocator<char> *)local_368);
  pSVar13 = tcu::operator<<((SeedBuilder *)local_3a8,(string *)local_1e8);
  pSVar13 = tcu::operator<<(pSVar13,this->m_iterationNdx);
  pSVar13 = tcu::operator<<(pSVar13,this->m_texFormat);
  pSVar13 = tcu::operator<<(pSVar13,local_260.minFilter);
  pSVar13 = tcu::operator<<(pSVar13,local_260.magFilter);
  pSVar13 = tcu::operator<<(pSVar13,(((this->m_texture).
                                      super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>
                                      .m_data.ptr)->m_refTexture).m_width);
  tcu::operator<<(pSVar13,(((this->m_texture).
                            super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.
                            m_data.ptr)->m_refTexture).m_height);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,(ulong)((long)local_1d8 + 1));
  }
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_348,renderTarget,0x80,0x80,local_3a8._0_4_);
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_378.m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)7> *)0x0;
  glu::TextureTestUtil::computeQuadTexCoord2D(&local_68,&local_260.p0,&local_260.p1);
  (**(code **)(lVar20 + 8))(0x84c0);
  (**(code **)(lVar20 + 0xb8))
            (0xde1,((this->m_texture).
                    super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr
                   )->m_glTexture);
  if (this->m_sampleMode == MODE_DEPTH) {
    uVar15 = 0x1902;
LAB_01512f20:
    (**(code **)(lVar20 + 0x1360))(0xde1,0x90ea,uVar15);
  }
  else if (this->m_sampleMode == MODE_STENCIL) {
    uVar15 = 0x1901;
    goto LAB_01512f20;
  }
  if ((float)local_260.compareMode == 0.0) {
    fVar18 = 7.27274e-43;
    (**(code **)(lVar20 + 0x1360))(0xde1,0x884c,0);
  }
  else {
    (**(code **)(lVar20 + 0x1360))(0xde1,0x884c,0x884e);
    fVar18 = (float)local_260.compareMode;
  }
  (**(code **)(lVar20 + 0x1360))(0xde1,0x884d,fVar18);
  if (this->m_stateType != STATE_SAMPLER_PARAM) {
    if (this->m_stateType == STATE_TEXTURE_PARAM) {
      pcVar2 = *(code **)(lVar20 + 0x1360);
      dVar6 = glu::getGLWrapMode(local_2b4.order);
      (*pcVar2)(0xde1,0x2802,dVar6);
      pcVar2 = *(code **)(lVar20 + 0x1360);
      dVar6 = glu::getGLWrapMode(local_2b4.type);
      (*pcVar2)(0xde1,0x2803,dVar6);
      pcVar2 = *(code **)(lVar20 + 0x1360);
      dVar6 = glu::getGLFilterMode(uStack_2ac._4_4_);
      (*pcVar2)(0xde1,0x2801,dVar6);
      pcVar2 = *(code **)(lVar20 + 0x1360);
      dVar6 = glu::getGLFilterMode((FilterMode)local_2a4);
      (*pcVar2)(0xde1,0x2800,dVar6);
      if ((ulong)this->m_channelClass < 5) {
        (**(code **)(lVar20 + *(long *)(&DAT_01c9d190 + (ulong)this->m_channelClass * 8)))
                  (0xde1,0x1004,&local_260.borderColor);
      }
    }
    goto LAB_01513233;
  }
  local_1e8._0_4_ = R;
  local_1e8._4_4_ = SNORM_INT8;
  _Stack_1e0._M_p = &DAT_3f8000003f800000;
  (**(code **)(lVar20 + 0x1360))(0xde1,0x2802,0x2901);
  (**(code **)(lVar20 + 0x1360))(0xde1,0x2803,0x2901);
  (**(code **)(lVar20 + 0x1360))(0xde1,0x2801,0x2600);
  (**(code **)(lVar20 + 0x1360))(0xde1,0x2800,0x2600);
  (**(code **)(lVar20 + 0x1358))(0xde1,0x1004,local_1e8);
  this_00 = (ObjectWrapper *)operator_new(0x18);
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_SAMPLER);
  glu::ObjectWrapper::ObjectWrapper(this_00,(Functions *)CONCAT44(extraout_var_00,iVar7),traits);
  local_3a8._0_4_ = R;
  local_3a8._4_4_ = SNORM_INT8;
  if (&(local_378.m_data.ptr)->super_ObjectWrapper != this_00) {
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
    ::reset(&local_378);
    local_378.m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)7> *)this_00;
  }
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
           *)local_3a8);
  pcVar2 = *(code **)(lVar20 + 0x1280);
  dVar6 = *(deUint32 *)((long)local_378.m_data.ptr + 0x10);
  dVar8 = glu::getGLWrapMode(local_2b4.order);
  (*pcVar2)(dVar6,0x2802,dVar8);
  pcVar2 = *(code **)(lVar20 + 0x1280);
  dVar6 = *(deUint32 *)((long)local_378.m_data.ptr + 0x10);
  dVar8 = glu::getGLWrapMode(local_2b4.type);
  (*pcVar2)(dVar6,0x2803,dVar8);
  pcVar2 = *(code **)(lVar20 + 0x1280);
  dVar6 = *(deUint32 *)((long)local_378.m_data.ptr + 0x10);
  dVar8 = glu::getGLFilterMode(uStack_2ac._4_4_);
  (*pcVar2)(dVar6,0x2801,dVar8);
  pcVar2 = *(code **)(lVar20 + 0x1280);
  dVar6 = *(deUint32 *)((long)local_378.m_data.ptr + 0x10);
  dVar8 = glu::getGLFilterMode((FilterMode)local_2a4);
  (*pcVar2)(dVar6,0x2800,dVar8);
  switch(this->m_channelClass) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    puVar10 = (undefined8 *)(lVar20 + 0x1278);
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    puVar10 = (undefined8 *)(lVar20 + 0x1260);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    puVar10 = (undefined8 *)(lVar20 + 0x1268);
    break;
  default:
    goto switchD_015131f0_default;
  }
  (*(code *)*puVar10)(*(deUint32 *)((long)local_378.m_data.ptr + 0x10),0x1004,&local_260.borderColor
                     );
switchD_015131f0_default:
  (**(code **)(lVar20 + 0xa8))(0,*(deUint32 *)((long)local_378.m_data.ptr + 0x10));
LAB_01513233:
  dVar6 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar6,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureBorderClampTests.cpp"
                  ,0x35f);
  (**(code **)(lVar20 + 0x1a00))(local_348.x,local_348.y,local_348.width,local_348.height);
  pfVar3 = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->m_samplingFunction == SAMPLE_FILTER) {
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              ((this->m_renderer).
               super_UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
               .m_data.ptr,0,
               local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(RenderParams *)local_2f8);
  }
  else {
    local_368._0_8_ = &local_358;
    local_358 = 0x697469736f705f61;
    local_350 = 0x6e6f;
    local_368._8_8_ = 10;
    local_34e = 0;
    local_3a8._0_4_ = A;
    local_390 = 0x697469736f705f61;
    local_388 = 0x6e6f;
    local_398 = (undefined1 *)0xa;
    local_386 = 0;
    local_380 = 0;
    local_1e8._0_4_ = A;
    _Stack_1e0._M_p = local_1d8 + 8;
    local_3a8._8_8_ = &local_390;
    std::__cxx11::string::_M_construct<char*>((string *)&_Stack_1e0,&local_390);
    local_1c0 = local_380;
    uStack_1b8 = 8;
    VStack_1b4 = VTX_COMP_CONVERT_NONE;
    DStack_1b0 = 4;
    iStack_1ac = 4;
    local_1a8 = 0;
    local_1a0 = Functional::(anonymous_namespace)::TextureBorderClampTest::
                renderQuad(float_const*,glu::TextureTestUtil::ReferenceParams_const&)::position;
    if ((long *)local_3a8._8_8_ != &local_390) {
      operator_delete((void *)local_3a8._8_8_,local_390 + 1);
    }
    local_40 = 0x6f6f637865745f61;
    local_38 = 0x6472;
    local_50.m_value = 10;
    local_50._12_4_ = 0;
    local_36 = 0;
    local_3a8._0_4_ = A;
    local_390 = 0x6f6f637865745f61;
    local_388 = 0x6472;
    local_398 = (undefined1 *)0xa;
    local_386 = 0;
    local_380 = 0;
    local_198 = 1;
    plVar21 = &local_180;
    local_3a8._8_8_ = &local_390;
    local_190[0] = plVar21;
    local_50.m_getName = (GetNameFunc)&local_40;
    std::__cxx11::string::_M_construct<char*>((string *)local_190,&local_390);
    local_170[0] = (ios_base)(undefined1)local_380;
    local_170[1] = (ios_base)local_380._1_1_;
    local_170[2] = (ios_base)local_380._2_1_;
    local_170[3] = (ios_base)local_380._3_1_;
    local_168 = 8;
    uStack_160 = 0x400000002;
    local_158 = 0;
    local_150 = pfVar3;
    if ((long *)local_3a8._8_8_ != &local_390) {
      operator_delete((void *)local_3a8._8_8_,local_390 + 1);
    }
    if (local_50.m_getName != (GetNameFunc)&local_40) {
      operator_delete(local_50.m_getName,local_40 + 1);
    }
    if ((long *)local_368._0_8_ != &local_358) {
      operator_delete((void *)local_368._0_8_,local_358 + 1);
    }
    iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar20 = CONCAT44(extraout_var_01,iVar7);
    dVar6 = (((this->m_gatherProgram).
              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.
             ptr)->m_program).m_program;
    (**(code **)(lVar20 + 0x1680))(dVar6);
    pcVar2 = *(code **)(lVar20 + 0x14f0);
    uVar9 = (**(code **)(lVar20 + 0xb48))(dVar6,"u_sampler");
    (*pcVar2)(uVar9,0);
    if (this->m_useShadowSampler == true) {
      pcVar2 = *(code **)(lVar20 + 0x14e0);
      uVar9 = (**(code **)(lVar20 + 0xb48))(dVar6,"u_ref");
      (*pcVar2)(local_2d8,uVar9);
    }
    pcVar2 = *(code **)(lVar20 + 0x15a8);
    uVar9 = (**(code **)(lVar20 + 0xb48))(dVar6,"u_colorScale");
    (*pcVar2)(uVar9,1,&local_2d4);
    pcVar2 = *(code **)(lVar20 + 0x15a8);
    uVar9 = (**(code **)(lVar20 + 0xb48))(dVar6,"u_colorBias");
    (*pcVar2)(uVar9,1,&local_2c4);
    local_3a8._0_4_ = R;
    local_3a8._4_4_ = UNORM_INT32;
    local_3a8._8_4_ = 1;
    local_398 = Functional::(anonymous_namespace)::TextureBorderClampTest::
                renderQuad(float_const*,glu::TextureTestUtil::ReferenceParams_const&)::indices;
    glu::draw(((this->super_TestCase).m_context)->m_renderCtx,dVar6,2,
              (VertexArrayBinding *)local_1e8,(PrimitiveList *)local_3a8,(DrawUtilCallback *)0x0);
    lVar20 = -0xa0;
    do {
      if (plVar21 != (long *)plVar21[-2]) {
        operator_delete((long *)plVar21[-2],*plVar21 + 1);
      }
      plVar21 = plVar21 + -10;
      lVar20 = lVar20 + 0x50;
    } while (lVar20 != 0);
  }
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_3a8._0_4_ = RGBA;
  local_3a8._4_4_ = UNORM_INT8;
  if ((void *)local_310.m_pixels.m_cap != (void *)0x0) {
    local_310.m_pixels.m_cap = (size_t)local_310.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1e8,(TextureFormat *)local_3a8,local_310.m_width,
             local_310.m_height,1,(void *)local_310.m_pixels.m_cap);
  glu::readPixels(context,local_348.x,local_348.y,(PixelBufferAccess *)local_1e8);
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  ::reset(&local_378);
  if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  verifyImage(this,&local_310,&local_260,(ReferenceParams *)local_2f8);
  iVar19 = this->m_iterationNdx + 1;
  this->m_iterationNdx = iVar19;
  iVar7 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  if (iVar19 == iVar7) {
    tcu::ResultCollector::setTestContextResult
              (&this->m_result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  }
  tcu::Surface::~Surface(&local_310);
  tcu::TestLog::endSection(local_318.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.description._M_dataplus._M_p != &local_260.description.field_2) {
    operator_delete(local_260.description._M_dataplus._M_p,
                    local_260.description.field_2._M_allocated_capacity + 1);
  }
  return (uint)(iVar19 != iVar7);
}

Assistant:

TextureBorderClampTest::IterateResult TextureBorderClampTest::iterate (void)
{
	const IterationConfig						iterationConfig		= getIteration(m_iterationNdx);
	const std::string							iterationDesc		= "Iteration " + de::toString(m_iterationNdx+1) + (iterationConfig.description.empty() ? ("") : (" - " + iterationConfig.description));
	const tcu::ScopedLogSection					section				(m_testCtx.getLog(), "Iteration", iterationDesc);
	tcu::Surface								renderedFrame		(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	const glu::TextureTestUtil::ReferenceParams	samplerParams		= genSamplerParams(iterationConfig);

	logParams(iterationConfig, samplerParams);
	renderTo(renderedFrame, iterationConfig, samplerParams);
	verifyImage(renderedFrame, iterationConfig, samplerParams);

	if (++m_iterationNdx == getNumIterations())
	{
		m_result.setTestContextResult(m_testCtx);
		return STOP;
	}
	return CONTINUE;
}